

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_deconvolution_batchnorm(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  pointer piVar11;
  ulong uVar12;
  int j;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  ulong local_b0;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_78;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar14 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_b0 = 1;
  uVar17 = 0;
  do {
    if (uVar17 == uVar14) {
      return 0;
    }
    bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar17]->type,"Deconvolution")
    ;
    if (!bVar9) {
      iVar2 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar17]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar15 = local_b0; uVar15 < uVar14; uVar15 = uVar15 + 1) {
        bVar9 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar15]->type,"BatchNorm")
        ;
        if (((!bVar9) &&
            (pLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar15],
            piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar5 == 4)) && (*piVar5 == iVar2)) {
          if (uVar14 != uVar15) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar17];
            pLVar7 = ppLVar6[uVar15];
            fprintf(_stderr,"fuse_deconvolution_batchnorm %s %s\n",(pLVar4->name)._M_dataplus._M_p);
            uVar10 = *(uint *)&pLVar7[1]._vptr_Layer;
            fVar1 = *(float *)((long)&pLVar7[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&a,(long)(int)uVar10,(allocator_type *)&local_78);
            std::vector<float,_std::allocator<float>_>::vector
                      (&b,(long)(int)uVar10,(allocator_type *)&local_78);
            uVar15 = 0;
            if (0 < (int)uVar10) {
              uVar15 = (ulong)uVar10;
            }
            for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
              fVar18 = (float)(*(pointer *)
                                ((long)&pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl + 0x10))[uVar16] + fVar1;
              if (fVar18 < 0.0) {
                fVar18 = sqrtf(fVar18);
              }
              else {
                fVar18 = SQRT(fVar18);
              }
              lVar8 = *(long *)&pLVar7[1].one_blob_only;
              a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar16] =
                   *(float *)(*(long *)&pLVar7[2].support_tensor_storage + uVar16 * 4) -
                   (*(float *)(lVar8 + uVar16 * 4) *
                   *(float *)(pLVar7[1].name._M_dataplus._M_p + uVar16 * 4)) / fVar18;
              b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar16] = *(float *)(lVar8 + uVar16 * 4) / fVar18;
            }
            if (*(int *)((long)&pLVar4[1].type._M_string_length + 4) == 0) {
              *(undefined4 *)((long)&pLVar4[1].type._M_string_length + 4) = 1;
              ncnn::Mat::Mat(&local_78,uVar10,4,(Allocator *)0x0);
              ncnn::Mat::operator=((Mat *)&pLVar4[2].one_blob_only,&local_78);
              ncnn::Mat::~Mat(&local_78);
              ncnn::Mat::fill((Mat *)&pLVar4[2].one_blob_only,0.0);
            }
            uVar10 = *(int *)&pLVar4[1].type.field_2 / (int)uVar10;
            piVar11 = *(pointer *)
                       ((long)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8);
            lVar8 = *(long *)&pLVar4[2].one_blob_only;
            uVar16 = 0;
            if (0 < (int)uVar10) {
              uVar16 = (ulong)uVar10;
            }
            for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
              for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                piVar11[uVar13] =
                     (int)(b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12] * (float)piVar11[uVar13]);
              }
              *(float *)(lVar8 + uVar12 * 4) =
                   *(float *)(lVar8 + uVar12 * 4) *
                   b.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12] +
                   a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
              piVar11 = piVar11 + (int)uVar10;
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&b.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&a.super__Vector_base<float,_std::allocator<float>_>);
            iVar2 = *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar2;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar2].producer = (int)uVar17;
            std::__cxx11::string::assign((char *)&pLVar7->type);
          }
          break;
        }
      }
    }
    uVar17 = uVar17 + 1;
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolution_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - BatchNorm to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolution_batchnorm %s %s\n", deconvolution->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolution->bias_term == 0)
            {
                // init bias as zero
                deconvolution->bias_term = 1;
                deconvolution->bias_data = ncnn::Mat(channels);
                deconvolution->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolution->weight_data_size / channels;

            float* weight = deconvolution->weight_data;
            float* bias = deconvolution->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}